

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

base_learner * ftrl_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  element_type *peVar2;
  undefined8 uVar3;
  int iVar4;
  option_group_definition *poVar5;
  ostream *poVar6;
  typed_option<unsigned_long> *ptVar7;
  element_type eVar8;
  learner<ftrl,_example> *plVar9;
  uint32_t *puVar10;
  code *predict;
  code *pcVar11;
  float fVar12;
  bool pistol;
  bool ftrl_option;
  free_ptr<ftrl> b;
  allocator local_678;
  allocator local_677;
  allocator local_676;
  allocator local_675;
  allocator local_674;
  allocator local_673;
  allocator local_672;
  allocator local_671;
  string algorithm_name;
  string local_640 [64];
  bool local_600;
  string local_5d0 [32];
  string local_5b0;
  string local_590 [32];
  string local_570;
  string local_550 [32];
  string local_530;
  string local_510 [32];
  string local_4f0;
  string local_4d0;
  option_group_definition new_options;
  undefined1 local_478 [112];
  bool local_408;
  undefined1 local_3d8 [160];
  undefined1 local_338 [160];
  typed_option<float> local_298;
  typed_option<float> local_1f8;
  typed_option<bool> local_158;
  typed_option<bool> local_b8;
  
  scoped_calloc_or_throw<ftrl>();
  ftrl_option = false;
  pistol = false;
  std::__cxx11::string::string
            ((string *)&local_4d0,"Follow the Regularized Leader",(allocator *)&algorithm_name);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::string((string *)&local_4f0,"ftrl",&local_671);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&algorithm_name,&local_4f0,&ftrl_option);
  local_600 = true;
  std::__cxx11::string::string(local_510,"FTRL: Follow the Proximal Regularized Leader",&local_672);
  std::__cxx11::string::_M_assign(local_640);
  VW::config::typed_option<bool>::typed_option(&local_b8,(typed_option<bool> *)&algorithm_name);
  poVar5 = VW::config::option_group_definition::add<bool>(&new_options,&local_b8);
  std::__cxx11::string::string((string *)&local_530,"pistol",&local_673);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_478,&local_530,&pistol);
  local_408 = true;
  std::__cxx11::string::string(local_550,"FTRL beta parameter",&local_674);
  std::__cxx11::string::_M_assign((string *)(local_478 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_158,(typed_option<bool> *)local_478);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_158);
  std::__cxx11::string::string((string *)&local_570,"ftrl_alpha",&local_675);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_3d8,&local_570,
             &(b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
              ._M_head_impl)->ftrl_alpha);
  std::__cxx11::string::string(local_590,"Learning rate for FTRL optimization",&local_676);
  std::__cxx11::string::_M_assign((string *)(local_3d8 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_1f8,(typed_option<float> *)local_3d8);
  poVar5 = VW::config::option_group_definition::add<float>(poVar5,&local_1f8);
  std::__cxx11::string::string((string *)&local_5b0,"ftrl_beta",&local_677);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_338,&local_5b0,
             &(b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
              ._M_head_impl)->ftrl_beta);
  std::__cxx11::string::string(local_5d0,"Learning rate for FTRL optimization",&local_678);
  std::__cxx11::string::_M_assign((string *)(local_338 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_298,(typed_option<float> *)local_338);
  VW::config::option_group_definition::add<float>(poVar5,&local_298);
  VW::config::typed_option<float>::~typed_option(&local_298);
  std::__cxx11::string::~string(local_5d0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_338);
  std::__cxx11::string::~string((string *)&local_5b0);
  VW::config::typed_option<float>::~typed_option(&local_1f8);
  std::__cxx11::string::~string(local_590);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_3d8);
  std::__cxx11::string::~string((string *)&local_570);
  VW::config::typed_option<bool>::~typed_option(&local_158);
  std::__cxx11::string::~string(local_550);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_478);
  std::__cxx11::string::~string((string *)&local_530);
  VW::config::typed_option<bool>::~typed_option(&local_b8);
  std::__cxx11::string::~string(local_510);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&algorithm_name);
  std::__cxx11::string::~string((string *)&local_4f0);
  (**options->_vptr_options_i)(options,&new_options);
  if (ftrl_option == false) {
    if (pistol == false) {
      plVar9 = (learner<ftrl,_example> *)0x0;
      goto LAB_001e65c9;
    }
    std::__cxx11::string::string((string *)&algorithm_name,"ftrl_alpha",(allocator *)local_478);
    iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
    if ((char)iVar4 == '\0') {
      fVar12 = 1.0;
    }
    else {
      fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
    }
    (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_alpha = fVar12;
    std::__cxx11::string::~string((string *)&algorithm_name);
    std::__cxx11::string::string((string *)&algorithm_name,"ftrl_beta",(allocator *)local_478);
    iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
    if ((char)iVar4 != '\0') goto LAB_001e630e;
    fVar12 = 0.5;
  }
  else {
    std::__cxx11::string::string((string *)&algorithm_name,"ftrl_alpha",(allocator *)local_478);
    iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
    if ((char)iVar4 == '\0') {
      fVar12 = 0.005;
    }
    else {
      fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
    }
    (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_alpha = fVar12;
    std::__cxx11::string::~string((string *)&algorithm_name);
    std::__cxx11::string::string((string *)&algorithm_name,"ftrl_beta",(allocator *)local_478);
    iVar4 = (*options->_vptr_options_i[1])(options,&algorithm_name);
    if ((char)iVar4 == '\0') {
      fVar12 = 0.1;
    }
    else {
LAB_001e630e:
      fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_beta;
    }
  }
  (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->ftrl_beta = fVar12;
  std::__cxx11::string::~string((string *)&algorithm_name);
  (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->all = all;
  (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  algorithm_name._M_dataplus._M_p = (pointer)&algorithm_name.field_2;
  algorithm_name._M_string_length = 0;
  algorithm_name.field_2._M_local_buf[0] = '\0';
  if (ftrl_option == true) {
    std::__cxx11::string::assign((char *)&algorithm_name);
    pcVar11 = learn_proximal<false>;
    if (all->audit != false) {
      pcVar11 = learn_proximal<true>;
    }
  }
  else if (pistol == true) {
    std::__cxx11::string::assign((char *)&algorithm_name);
    pcVar11 = learn_pistol;
  }
  else {
    pcVar11 = (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)0x0;
  }
  fVar12 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl)->ftrl_beta;
  ((b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_alpha =
       (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
       _M_head_impl)->ftrl_alpha;
  ((b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_beta = fVar12;
  pvVar1 = (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl)->all;
  ((b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l1_lambda = pvVar1->l1_lambda;
  ((b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l2_lambda = pvVar1->l2_lambda;
  parameters::stride_shift(&all->weights,2);
  if (all->quiet == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Enabling FTRL based optimization");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Algorithm used: ");
    poVar6 = std::operator<<(poVar6,(string *)&algorithm_name);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cerr,"ftrl_alpha = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cerr,"ftrl_beta = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_beta);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    std::__cxx11::string::string((string *)local_478,"early_terminate",(allocator *)local_3d8);
    ptVar7 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)local_478);
    peVar2 = (ptVar7->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      eVar8 = 0;
    }
    else {
      eVar8 = *peVar2;
    }
    (b._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->early_stop_thres = eVar8;
    std::__cxx11::string::~string((string *)local_478);
  }
  predict = predict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    predict = predict<true>;
  }
  puVar10 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar10 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar9 = LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                     (&b,pcVar11,predict,1L << ((byte)*puVar10 & 0x3f));
  uVar3 = *(undefined8 *)(plVar9 + 0x18);
  *(undefined8 *)(plVar9 + 0x48) = uVar3;
  *(code **)(plVar9 + 0x50) = sensitivity;
  pcVar11 = multipredict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    pcVar11 = multipredict<true>;
  }
  *(code **)(plVar9 + 0x40) = pcVar11;
  *(code **)(plVar9 + 0x80) = save_load;
  *(undefined8 *)(plVar9 + 0x70) = uVar3;
  *(undefined8 *)(plVar9 + 0x78) = *(undefined8 *)(plVar9 + 0x20);
  *(undefined8 *)(plVar9 + 0x88) = uVar3;
  *(undefined8 *)(plVar9 + 0x90) = *(undefined8 *)(plVar9 + 0x20);
  *(code **)(plVar9 + 0x98) = end_pass;
  std::__cxx11::string::~string((string *)&algorithm_name);
LAB_001e65c9:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::~unique_ptr(&b);
  return (base_learner *)plVar9;
}

Assistant:

base_learner* ftrl_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<ftrl>();
  bool ftrl_option = false;
  bool pistol = false;

  option_group_definition new_options("Follow the Regularized Leader");
  new_options.add(make_option("ftrl", ftrl_option).keep().help("FTRL: Follow the Proximal Regularized Leader"))
      .add(make_option("pistol", pistol).keep().help("FTRL beta parameter"))
      .add(make_option("ftrl_alpha", b->ftrl_alpha).help("Learning rate for FTRL optimization"))
      .add(make_option("ftrl_beta", b->ftrl_beta).help("Learning rate for FTRL optimization"));
  options.add_and_parse(new_options);

  if (!ftrl_option && !pistol)
  {
    return nullptr;
  }

  // Defaults that are specific to the mode that was chosen.
  if (ftrl_option)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 0.005f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.1f;
  }
  else if (pistol)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 1.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.5f;
  }

  b->all = &all;
  b->no_win_counter = 0;

  void (*learn_ptr)(ftrl&, single_learner&, example&) = nullptr;

  string algorithm_name;
  if (ftrl_option)
  {
    algorithm_name = "Proximal-FTRL";
    if (all.audit)
      learn_ptr = learn_proximal<true>;
    else
      learn_ptr = learn_proximal<false>;
  }
  else if (pistol)
  {
    algorithm_name = "PiSTOL";
    learn_ptr = learn_pistol;
  }
  b->data.ftrl_alpha = b->ftrl_alpha;
  b->data.ftrl_beta = b->ftrl_beta;
  b->data.l1_lambda = b->all->l1_lambda;
  b->data.l2_lambda = b->all->l2_lambda;

  all.weights.stride_shift(2);  // NOTE: for more parameter storage

  if (!all.quiet)
  {
    cerr << "Enabling FTRL based optimization" << endl;
    cerr << "Algorithm used: " << algorithm_name << endl;
    cerr << "ftrl_alpha = " << b->ftrl_alpha << endl;
    cerr << "ftrl_beta = " << b->ftrl_beta << endl;
  }

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  learner<ftrl, example>* l;
  if (all.audit || all.hash_inv)
    l = &init_learner(b, learn_ptr, predict<true>, UINT64_ONE << all.weights.stride_shift());
  else
    l = &init_learner(b, learn_ptr, predict<false>, UINT64_ONE << all.weights.stride_shift());
  l->set_sensitivity(sensitivity);
  if (all.audit || all.hash_inv)
    l->set_multipredict(multipredict<true>);
  else
    l->set_multipredict(multipredict<false>);
  l->set_save_load(save_load);
  l->set_end_pass(end_pass);
  return make_base(*l);
}